

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall icu_63::FormatParser::set(FormatParser *this,UnicodeString *pattern)

{
  int iVar1;
  bool bVar2;
  UnicodeString local_68;
  int32_t local_24;
  int local_20;
  int32_t len;
  TokenStatus result;
  int32_t startPos;
  UnicodeString *pattern_local;
  FormatParser *this_local;
  
  len = 0;
  local_20 = 0;
  local_24 = 0;
  this->itemNumber = 0;
  _result = pattern;
  pattern_local = (UnicodeString *)this;
  do {
    local_20 = (*this->_vptr_FormatParser[2])(this,_result,(ulong)(uint)len,&local_24);
    if (local_20 != 1) {
      return;
    }
    icu_63::UnicodeString::UnicodeString(&local_68,_result,len,local_24);
    iVar1 = this->itemNumber;
    this->itemNumber = iVar1 + 1;
    icu_63::UnicodeString::operator=
              ((UnicodeString *)(&this->field_0x8 + (long)iVar1 * 0x40),&local_68);
    icu_63::UnicodeString::~UnicodeString(&local_68);
    len = local_24 + len;
    bVar2 = false;
    if (local_20 == 1) {
      bVar2 = this->itemNumber < 0x32;
    }
  } while (bVar2);
  return;
}

Assistant:

void
FormatParser::set(const UnicodeString& pattern) {
    int32_t startPos = 0;
    TokenStatus result = START;
    int32_t len = 0;
    itemNumber = 0;

    do {
        result = setTokens( pattern, startPos, &len );
        if ( result == ADD_TOKEN )
        {
            items[itemNumber++] = UnicodeString(pattern, startPos, len );
            startPos += len;
        }
        else {
            break;
        }
    } while (result==ADD_TOKEN && itemNumber < MAX_DT_TOKEN);
}